

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_AlmostComplexEq_Test::
iu_SyntaxTest_x_iutest_x_AlmostComplexEq_Test(iu_SyntaxTest_x_iutest_x_AlmostComplexEq_Test *this)

{
  iu_SyntaxTest_x_iutest_x_AlmostComplexEq_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_SyntaxTest_x_iutest_x_AlmostComplexEq_Test_006277c8;
  return;
}

Assistant:

IUTEST(SyntaxTest, AlmostComplexEq)
{
    ::std::complex<double> c(1.0, 0.0);
    if( double x = 1.0 )
        IUTEST_ASSERT_ALMOST_EQ(c, x);
    if( double x = 1.0 )
        IUTEST_EXPECT_ALMOST_EQ(x, c);
    if( double x = 1.0 )
        IUTEST_INFORM_ALMOST_EQ(::std::complex<double>(x, x), c);
    if( double x = 1.0 )
        IUTEST_ASSUME_ALMOST_EQ(c, ::std::complex<double>(x, x));
}